

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O3

bool __thiscall glslang::TConstUnion::operator<(TConstUnion *this,TConstUnion *constant)

{
  bool bVar1;
  bool bVar2;
  
  if (this->type != constant->type) {
    __assert_fail("type == constant.type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x182,"bool glslang::TConstUnion::operator<(const TConstUnion &) const");
  }
  switch(this->type) {
  case EbtDouble:
    bVar1 = (this->field_0).dConst <= (constant->field_0).dConst &&
            (constant->field_0).dConst != (this->field_0).dConst;
    break;
  default:
    __assert_fail("false && \"Default missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x1b1,"bool glslang::TConstUnion::operator<(const TConstUnion &) const");
  case EbtInt8:
    bVar2 = SBORROW1((this->field_0).i8Const,(constant->field_0).i8Const);
    bVar1 = (char)((this->field_0).i8Const - (constant->field_0).i8Const) < '\0';
    goto LAB_004715ba;
  case EbtUint8:
    bVar1 = (this->field_0).u8Const < (constant->field_0).u8Const;
    break;
  case EbtInt16:
    bVar2 = SBORROW2((this->field_0).i16Const,(constant->field_0).i16Const);
    bVar1 = (short)((this->field_0).i16Const - (constant->field_0).i16Const) < 0;
    goto LAB_004715ba;
  case EbtUint16:
    bVar1 = (this->field_0).u16Const < (constant->field_0).u16Const;
    break;
  case EbtInt:
    bVar2 = SBORROW4((this->field_0).iConst,(constant->field_0).iConst);
    bVar1 = (this->field_0).iConst - (constant->field_0).iConst < 0;
    goto LAB_004715ba;
  case EbtUint:
    bVar1 = (this->field_0).uConst < (constant->field_0).uConst;
    break;
  case EbtInt64:
    bVar2 = SBORROW8((this->field_0).i64Const,(constant->field_0).i64Const);
    bVar1 = (this->field_0).i64Const - (constant->field_0).i64Const < 0;
LAB_004715ba:
    bVar1 = bVar2 != bVar1;
    break;
  case EbtUint64:
    bVar1 = (this->field_0).u64Const < (constant->field_0).u64Const;
  }
  return bVar1;
}

Assistant:

bool operator<(const TConstUnion& constant) const
    {
        assert(type == constant.type);
        switch (type) {
        case EbtInt8:
            if (i8Const < constant.i8Const)
                return true;

            return false;
        case EbtUint8:
            if (u8Const < constant.u8Const)
                return true;

            return false;
        case EbtInt16:
            if (i16Const < constant.i16Const)
                return true;

            return false;
        case EbtUint16:
            if (u16Const < constant.u16Const)
                return true;
            return false;
        case EbtInt64:
            if (i64Const < constant.i64Const)
                return true;

            return false;
        case EbtUint64:
            if (u64Const < constant.u64Const)
                return true;

            return false;
        case EbtDouble:
            if (dConst < constant.dConst)
                return true;

            return false;
        case EbtInt:
            if (iConst < constant.iConst)
                return true;

            return false;
        case EbtUint:
            if (uConst < constant.uConst)
                return true;

            return false;
        default:
            assert(false && "Default missing");
            return false;
        }
    }